

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs5ReplaceImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,JavascriptString *replace,bool noResult)

{
  char16 cVar1;
  RegexPattern *pattern;
  RecyclableObject *nonMatchValue;
  code *pcVar2;
  undefined8 uVar3;
  Matcher *pMVar4;
  bool isGlobal;
  bool isSticky;
  bool bVar5;
  uint16 uVar6;
  ushort uVar7;
  ushort uVar8;
  charcount_t cVar9;
  charcount_t inputLength;
  uint uVar10;
  charcount_t cVar11;
  uint uVar12;
  CharCount CVar13;
  char16 *pcVar14;
  char16 *input_00;
  GroupInfo GVar15;
  undefined4 *puVar16;
  RecyclableObject *aValue;
  JavascriptString *pJVar17;
  ushort uVar18;
  int iVar19;
  uint uVar20;
  CharCount CVar21;
  uint uVar22;
  Type TVar23;
  ulong uVar24;
  GroupInfo GVar25;
  JavascriptLibrary *pJVar26;
  undefined7 in_register_00000081;
  GroupInfo lastSuccessfulMatch;
  ulong uVar27;
  undefined1 local_330 [8];
  Builder<256U> concatenated;
  CharCount *substitutionOffsets;
  undefined1 local_f0 [8];
  RegexMatchState state;
  Type local_78;
  Type local_60;
  GroupInfo local_50;
  CharCount appendCharLength;
  
  lastSuccessfulMatch._1_7_ = in_register_00000081;
  lastSuccessfulMatch.offset._0_1_ = noResult;
  pattern = (regularExpression->pattern).ptr;
  pcVar14 = JavascriptString::GetString(replace);
  cVar9 = JavascriptString::GetLength(replace);
  input_00 = JavascriptString::GetString(input);
  inputLength = JavascriptString::GetLength(input);
  state.matcher = (Matcher *)regularExpression;
  RegexHelperTrace(scriptContext,(Use)regularExpression,(JavascriptRegExp *)input,replace,
                   (JavascriptString *)lastSuccessfulMatch);
  PrimBeginMatch((RegexMatchState *)local_f0,scriptContext,pattern,input_00,
                 lastSuccessfulMatch.offset,true);
  isGlobal = UnifiedRegex::RegexPattern::IsGlobal(pattern);
  isSticky = UnifiedRegex::RegexPattern::IsSticky(pattern);
  pMVar4 = state.matcher;
  uVar12 = 0;
  if (isSticky && !isGlobal) {
    if ((state.matcher)->previousQcTime == 0xfffffffe) {
      JavascriptRegExp::CacheLastIndex((JavascriptRegExp *)state.matcher);
    }
    uVar12 = pMVar4->previousQcTime;
  }
  local_60.ptr = (RuntimeFunction *)0xffffffff;
  if (noResult) {
    if (inputLength < uVar12) {
      TVar23 = 0;
      GVar15.offset = 0;
      GVar15.length = 0;
      local_78.ptr = (RuntimeFunction *)0xffffffff;
    }
    else {
      lastSuccessfulMatch.length = 0;
      lastSuccessfulMatch.offset = uVar12;
      GVar15 = PrimMatch((RegexMatchState *)local_f0,scriptContext,pattern,inputLength,uVar12);
      local_78.ptr = (RuntimeFunction *)((ulong)GVar15 >> 0x20);
      if (local_78.ptr == (RuntimeFunction *)0xffffffff) {
        GVar25.offset = 0;
        GVar25.length = 0;
      }
      else {
        do {
          GVar25 = GVar15;
          GVar15 = GVar25;
          if (!isGlobal) break;
          iVar19 = (int)local_78.ptr;
          if ((ulong)GVar25 >> 0x20 == 0) {
            iVar19 = 1;
          }
          lastSuccessfulMatch.offset = GVar25.offset + iVar19;
          lastSuccessfulMatch.length = 0;
          if (inputLength < lastSuccessfulMatch.offset) {
            local_78.ptr = (RuntimeFunction *)0xffffffff;
            break;
          }
          GVar15 = PrimMatch((RegexMatchState *)local_f0,scriptContext,pattern,inputLength,
                             lastSuccessfulMatch.offset);
          local_78.ptr = (RuntimeFunction *)((ulong)GVar15 >> 0x20);
        } while (local_78.ptr != (RuntimeFunction *)0xffffffff);
        local_60.ptr = (RuntimeFunction *)((ulong)GVar25 >> 0x20);
      }
      TVar23 = GVar25.offset;
    }
    pJVar26 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    pJVar17 = JavascriptLibrary::GetEmptyString(pJVar26);
  }
  else {
    concatenated.isFinalized = false;
    concatenated._545_7_ = 0;
    uVar10 = GetReplaceSubstitutions
                       (pcVar14,cVar9,(ArenaAllocator *)(state.input + 4),
                        (CharCount **)&concatenated.isFinalized);
    pJVar26 = (JavascriptLibrary *)local_330;
    CompoundString::Builder<256U>::Builder((Builder<256U> *)pJVar26,scriptContext);
    if (uVar12 != 0) {
      CVar13 = inputLength;
      if (uVar12 < inputLength) {
        CVar13 = uVar12;
      }
      if (concatenated._520_8_ == 0) {
        lastSuccessfulMatch.offset = 0;
        lastSuccessfulMatch.length = 0;
        pJVar26 = (JavascriptLibrary *)input;
        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                  (input,0,CVar13,(Builder<256U> *)local_330,false);
      }
      else {
        pJVar26 = (JavascriptLibrary *)concatenated._520_8_;
        CompoundString::Append((CompoundString *)concatenated._520_8_,input,0,CVar13);
      }
    }
    uVar3 = concatenated._544_8_;
    if (inputLength < uVar12) {
      local_50.offset = 0;
      local_50.length = 0;
      local_78.ptr = (RuntimeFunction *)0xffffffff;
      local_60.ptr = (RuntimeFunction *)0xffffffff;
      GVar15.offset = 0;
      GVar15.length = 0;
    }
    else {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pJVar26 = (JavascriptLibrary *)local_f0;
      lastSuccessfulMatch.length = 0;
      lastSuccessfulMatch.offset = uVar12;
      GVar15 = PrimMatch((RegexMatchState *)pJVar26,scriptContext,pattern,inputLength,uVar12);
      local_78.ptr = (RuntimeFunction *)((ulong)GVar15 >> 0x20);
      if (local_78.ptr == (RuntimeFunction *)0xffffffff) {
        local_50.offset = 0;
        local_50.length = 0;
        local_60.ptr = (RuntimeFunction *)0xffffffff;
      }
      else {
        do {
          local_50 = GVar15;
          uVar20 = local_50.offset;
          if (concatenated._520_8_ == 0) {
            lastSuccessfulMatch.offset = 0;
            lastSuccessfulMatch.length = 0;
            CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                      (input,uVar12,uVar20 - uVar12,(Builder<256U> *)local_330,false);
          }
          else {
            CompoundString::Append
                      ((CompoundString *)concatenated._520_8_,input,uVar12,uVar20 - uVar12);
          }
          local_60.ptr = (RuntimeFunction *)((ulong)local_50 >> 0x20);
          pJVar26 = (JavascriptLibrary *)replace;
          if (uVar3 == 0) {
            if (concatenated._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (replace,(Builder<256U> *)local_330,false);
            }
            else {
              pJVar26 = (JavascriptLibrary *)concatenated._520_8_;
              CompoundString::Append((CompoundString *)concatenated._520_8_,replace);
            }
          }
          else {
            uVar6 = UnifiedRegex::RegexPattern::NumGroups(pattern);
            nonMatchValue =
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
            cVar9 = JavascriptString::GetLength(input);
            pcVar14 = JavascriptString::GetString(replace);
            cVar11 = JavascriptString::GetLength(replace);
            if ((int)uVar10 < 1) {
              CVar13 = 0;
            }
            else {
              appendCharLength = local_50.length;
              uVar12 = appendCharLength + uVar20;
              uVar27 = 0;
              uVar24 = 0;
              do {
                CVar13 = *(CharCount *)(uVar3 + uVar27 * 4);
                CVar21 = (CharCount)uVar24;
                if (concatenated._520_8_ == 0) {
                  lastSuccessfulMatch.offset = 0;
                  lastSuccessfulMatch.length = 0;
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar21,CVar13 - CVar21,(Builder<256U> *)local_330,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,replace,CVar21,CVar13 - CVar21);
                }
                uVar24 = (ulong)(CVar13 + 1);
                cVar1 = pcVar14[uVar24];
                uVar7 = cVar1 + L'￐';
                if (uVar7 < 10) {
                  uVar22 = CVar13 + 2;
                  uVar24 = (ulong)uVar22;
                  uVar8 = uVar7;
                  if ((uVar22 < cVar11) && ((ushort)(pcVar14[uVar22] + L'￐') < 10)) {
                    uVar18 = pcVar14[uVar22] + L'￐' + uVar7 * 10;
                    uVar8 = uVar18;
                    if (uVar6 <= uVar18) {
                      uVar8 = uVar7;
                    }
                    if (uVar6 > uVar18) {
                      uVar24 = (ulong)(CVar13 + 3);
                    }
                  }
                  if (uVar8 == 0 || uVar6 <= uVar8) {
                    CVar21 = (int)uVar24 - CVar13;
                    if (concatenated._520_8_ == 0) {
LAB_00d4d46b:
                      lastSuccessfulMatch.offset = 0;
                      lastSuccessfulMatch.length = 0;
                      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                (replace,CVar13,CVar21,(Builder<256U> *)local_330,false);
                    }
                    else {
LAB_00d4d409:
                      CompoundString::Append
                                ((CompoundString *)concatenated._520_8_,replace,CVar13,CVar21);
                    }
                  }
                  else {
                    GVar15 = UnifiedRegex::RegexPattern::GetGroup(pattern,(uint)uVar8);
                    aValue = (RecyclableObject *)GetString(scriptContext,input,nonMatchValue,GVar15)
                    ;
                    bVar5 = VarIs<Js::JavascriptString>(aValue);
                    if (bVar5) {
                      pJVar17 = UnsafeVarTo<Js::JavascriptString>(aValue);
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (pJVar17,(Builder<256U> *)local_330,false);
                      }
                      else {
                        CompoundString::Append((CompoundString *)concatenated._520_8_,pJVar17);
                      }
                    }
                    else if (aValue != nonMatchValue) {
                      CVar21 = (int)uVar24 - CVar13;
                      if (concatenated._520_8_ != 0) goto LAB_00d4d409;
                      goto LAB_00d4d46b;
                    }
                  }
                }
                else {
                  if ((ushort)cVar1 < 0x27) {
                    if (cVar1 == L'$') {
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (L'$',(Builder<256U> *)local_330,false);
                      }
                      else {
                        CompoundString::Append((CompoundString *)concatenated._520_8_,L'$');
                      }
                    }
                    else {
                      if (cVar1 != L'&') {
LAB_00d4d488:
                        if (concatenated._520_8_ == 0) {
                          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                    (L'$',(Builder<256U> *)local_330,false);
                        }
                        else {
                          CompoundString::Append((CompoundString *)concatenated._520_8_,L'$');
                        }
                        goto LAB_00d4d668;
                      }
                      if (concatenated._520_8_ == 0) {
                        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                  (input_00 + ((ulong)local_50 & 0xffffffff),appendCharLength,
                                   (Builder<256U> *)local_330,false);
                      }
                      else {
                        CompoundString::Append
                                  ((CompoundString *)concatenated._520_8_,
                                   input_00 + ((ulong)local_50 & 0xffffffff),appendCharLength);
                      }
                    }
                  }
                  else if (cVar1 == L'\'') {
                    if (appendCharLength == 0xffffffff) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *puVar16 = 1;
                      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                                  ,0x60a,"(length != CharCountFlag)",
                                                  "length != CharCountFlag");
                      if (!bVar5) goto LAB_00d4d887;
                      *puVar16 = 0;
                    }
                    if (uVar12 < cVar9) {
                      if (appendCharLength == 0xffffffff) {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *puVar16 = 1;
                        bVar5 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                                  ,0x60a,"(length != CharCountFlag)",
                                                  "length != CharCountFlag");
                        if (!bVar5) {
LAB_00d4d887:
                          pcVar2 = (code *)invalidInstructionException();
                          (*pcVar2)();
                        }
                        *puVar16 = 0;
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *puVar16 = 1;
                        bVar5 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                                  ,0x60a,"(length != CharCountFlag)",
                                                  "length != CharCountFlag");
                        if (!bVar5) goto LAB_00d4d887;
                        *puVar16 = 0;
                      }
                      CVar21 = uVar12;
                      uVar22 = cVar9 - uVar12;
                      if (concatenated._520_8_ != 0) goto LAB_00d4d5ca;
LAB_00d4d652:
                      lastSuccessfulMatch.offset = 0;
                      lastSuccessfulMatch.length = 0;
                      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                (input,CVar21,uVar22,(Builder<256U> *)local_330,false);
                    }
                  }
                  else {
                    if (cVar1 != L'`') goto LAB_00d4d488;
                    if (concatenated._520_8_ == 0) {
                      CVar21 = 0;
                      uVar22 = uVar20;
                      goto LAB_00d4d652;
                    }
                    CVar21 = 0;
                    uVar22 = uVar20;
LAB_00d4d5ca:
                    CompoundString::Append
                              ((CompoundString *)concatenated._520_8_,input,CVar21,uVar22);
                  }
                  uVar24 = (ulong)(CVar13 + 2);
                }
LAB_00d4d668:
                CVar13 = (CharCount)uVar24;
                uVar27 = uVar27 + 1;
              } while (uVar10 != uVar27);
            }
            if (concatenated._520_8_ == 0) {
              lastSuccessfulMatch.offset = 0;
              lastSuccessfulMatch.length = 0;
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (replace,CVar13,cVar11 - CVar13,(Builder<256U> *)local_330,false);
            }
            else {
              pJVar26 = (JavascriptLibrary *)concatenated._520_8_;
              CompoundString::Append
                        ((CompoundString *)concatenated._520_8_,replace,CVar13,cVar11 - CVar13);
            }
          }
          if ((ulong)local_50 >> 0x20 == 0) {
            if (uVar20 < inputLength) {
              cVar1 = input_00[(ulong)local_50 & 0xffffffff];
              if (concatenated._520_8_ == 0) {
                pJVar26 = (JavascriptLibrary *)(ulong)(ushort)cVar1;
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (cVar1,(Builder<256U> *)local_330,false);
              }
              else {
                pJVar26 = (JavascriptLibrary *)concatenated._520_8_;
                CompoundString::Append((CompoundString *)concatenated._520_8_,cVar1);
              }
            }
            uVar12 = uVar20 + 1;
          }
          else {
            uVar12 = uVar20 + (int)local_78.ptr;
          }
          GVar15 = local_50;
          if (!isGlobal) break;
          if (inputLength < uVar12) {
            local_78.ptr = (RuntimeFunction *)0xffffffff;
            break;
          }
          pJVar26 = (JavascriptLibrary *)local_f0;
          lastSuccessfulMatch.length = 0;
          lastSuccessfulMatch.offset = uVar12;
          GVar15 = PrimMatch((RegexMatchState *)pJVar26,scriptContext,pattern,inputLength,uVar12);
          local_78.ptr = (RuntimeFunction *)((ulong)GVar15 >> 0x20);
        } while (local_78.ptr != (RuntimeFunction *)0xffffffff);
      }
    }
    pJVar17 = input;
    if (uVar12 != 0) {
      CVar13 = inputLength - uVar12;
      if (uVar12 <= inputLength && CVar13 != 0) {
        if (concatenated._520_8_ == 0) {
          lastSuccessfulMatch.offset = 0;
          lastSuccessfulMatch.length = 0;
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    (input,uVar12,CVar13,(Builder<256U> *)local_330,false);
        }
        else {
          CompoundString::Append((CompoundString *)concatenated._520_8_,input,uVar12,CVar13);
        }
      }
      pJVar26 = (JavascriptLibrary *)local_330;
      pJVar17 = CompoundString::Builder<256U>::ToString((Builder<256U> *)pJVar26);
    }
    TVar23 = local_50.offset;
  }
  if (state.input != (char16 *)0x0) {
    pJVar26 = (JavascriptLibrary *)scriptContext;
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,(TempArenaAllocatorObject *)state.input);
  }
  pMVar4 = state.matcher;
  PropagateLastMatchToRegex
            ((ScriptContext *)pJVar26,isGlobal,isSticky,(JavascriptRegExp *)state.matcher,
             lastSuccessfulMatch,
             (GroupInfo)((ulong)GVar15 & 0xffffffff | (long)local_78.ptr << 0x20));
  PropagateLastMatchToCtor
            (scriptContext,(JavascriptRegExp *)pMVar4,input,
             (GroupInfo)((ulong)TVar23 | (long)local_60.ptr << 0x20),false);
  return pJVar17;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* replaceStr = replace->GetString();
        CharCount replaceLength = replace->GetLength();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

        JavascriptString* newString = nullptr;

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, replace);
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, true);

        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        if (!noResult)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(replaceStr, replaceLength,
                 state.tempAllocatorObj->GetAllocator(), &substitutionOffsets);

            // Use to see if we already have partial result populated in concatenated
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);

            // If lastIndex > 0, append input[0..offset] characters to the result
            if (offset > 0)
            {
                concatenated.Append(input, 0, min(offset, inputLength));
            }

            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }

                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                concatenated.Append(input, offset, lastActualMatch.offset - offset);
                if (substitutionOffsets != 0)
                {
                    auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                        return GetGroup(scriptContext, pattern, input, nonMatchValue, captureIndex);
                    };
                    const char16* matchedString = inputStr + lastActualMatch.offset;
                    ReplaceFormatString(scriptContext, pattern->NumGroups(), getGroup, input, matchedString, lastActualMatch, replace, substitutions, substitutionOffsets, concatenated);
                }
                else
                {
                    concatenated.Append(replace);
                }
                if (lastActualMatch.length == 0)
                {
                    if (lastActualMatch.offset < inputLength)
                    {
                        concatenated.Append(inputStr[lastActualMatch.offset]);
                    }
                    offset = lastActualMatch.offset + 1;
                }
                else
                {
                    offset = lastActualMatch.EndOffset();
                }
            }
            while (isGlobal);

            if (offset == 0)
            {
                // There was no successful match so the result is the input string.
                newString = input;
            }
            else
            {
                if (offset < inputLength)
                {
                    concatenated.Append(input, offset, inputLength - offset);
                }
                newString = concatenated.ToString();
            }
            substitutionOffsets = 0;
        }
        else
        {
            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }
                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                offset = lastActualMatch.length == 0? lastActualMatch.offset + 1 : lastActualMatch.EndOffset();
            }
            while (isGlobal);
            newString = scriptContext->GetLibrary()->GetEmptyString();
        }

        PrimEndMatch(state, scriptContext, pattern);
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }